

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.c++
# Opt level: O0

ElementSize capnp::anon_unknown_70::elementSizeFor(Which elementType)

{
  Fault local_18;
  Fault f;
  Which elementType_local;
  
  switch(elementType) {
  case VOID:
    f.exception._7_1_ = VOID;
    break;
  case BOOL:
    f.exception._7_1_ = BIT;
    break;
  case INT8:
    f.exception._7_1_ = BYTE;
    break;
  case INT16:
    f.exception._7_1_ = TWO_BYTES;
    break;
  case INT32:
    f.exception._7_1_ = FOUR_BYTES;
    break;
  case INT64:
    f.exception._7_1_ = EIGHT_BYTES;
    break;
  case UINT8:
    f.exception._7_1_ = BYTE;
    break;
  case UINT16:
    f.exception._7_1_ = TWO_BYTES;
    break;
  case UINT32:
    f.exception._7_1_ = FOUR_BYTES;
    break;
  case UINT64:
    f.exception._7_1_ = EIGHT_BYTES;
    break;
  case FLOAT32:
    f.exception._7_1_ = FOUR_BYTES;
    break;
  case FLOAT64:
    f.exception._7_1_ = EIGHT_BYTES;
    break;
  case TEXT:
    f.exception._7_1_ = POINTER;
    break;
  case DATA:
    f.exception._7_1_ = POINTER;
    break;
  case LIST:
    f.exception._7_1_ = POINTER;
    break;
  case ENUM:
    f.exception._7_1_ = TWO_BYTES;
    break;
  case STRUCT:
    f.exception._7_1_ = INLINE_COMPOSITE;
    break;
  case INTERFACE:
    f.exception._7_1_ = POINTER;
    break;
  case ANY_POINTER:
    f.exception._4_2_ = elementType;
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[32]>
              (&local_18,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/dynamic.c++"
               ,0x5b,FAILED,(char *)0x0,"\"List(AnyPointer) not supported.\"",
               (char (*) [32])"List(AnyPointer) not supported.");
    kj::_::Debug::Fault::fatal(&local_18);
  default:
    f.exception._7_1_ = VOID;
  }
  return f.exception._7_1_;
}

Assistant:

ElementSize elementSizeFor(schema::Type::Which elementType) {
  switch (elementType) {
    case schema::Type::VOID: return ElementSize::VOID;
    case schema::Type::BOOL: return ElementSize::BIT;
    case schema::Type::INT8: return ElementSize::BYTE;
    case schema::Type::INT16: return ElementSize::TWO_BYTES;
    case schema::Type::INT32: return ElementSize::FOUR_BYTES;
    case schema::Type::INT64: return ElementSize::EIGHT_BYTES;
    case schema::Type::UINT8: return ElementSize::BYTE;
    case schema::Type::UINT16: return ElementSize::TWO_BYTES;
    case schema::Type::UINT32: return ElementSize::FOUR_BYTES;
    case schema::Type::UINT64: return ElementSize::EIGHT_BYTES;
    case schema::Type::FLOAT32: return ElementSize::FOUR_BYTES;
    case schema::Type::FLOAT64: return ElementSize::EIGHT_BYTES;

    case schema::Type::TEXT: return ElementSize::POINTER;
    case schema::Type::DATA: return ElementSize::POINTER;
    case schema::Type::LIST: return ElementSize::POINTER;
    case schema::Type::ENUM: return ElementSize::TWO_BYTES;
    case schema::Type::STRUCT: return ElementSize::INLINE_COMPOSITE;
    case schema::Type::INTERFACE: return ElementSize::POINTER;
    case schema::Type::ANY_POINTER: KJ_FAIL_ASSERT("List(AnyPointer) not supported."); break;
  }

  // Unknown type.  Treat it as zero-size.
  return ElementSize::VOID;
}